

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ExemptionDatabase.cpp
# Opt level: O3

void __thiscall
RenX::ExemptionDatabase::process_data
          (ExemptionDatabase *this,DataBuffer *buffer,FILE *file,fpos_t pos)

{
  uint8_t uVar1;
  uint32_t uVar2;
  uint8_t *puVar3;
  Entry *pEVar4;
  _Head_base<0UL,_RenX::ExemptionDatabase::Entry_*,_false> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pEVar4 = (Entry *)operator_new(0x58);
  pEVar4->ip = 0;
  pEVar4->prefix_length = '\0';
  *(undefined3 *)&pEVar4->field_0x35 = 0;
  (pEVar4->setter)._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)&pEVar4->flags = 0;
  (pEVar4->timestamp).__d.__r = 0;
  (pEVar4->length).__r = 0;
  pEVar4->steamid = 0;
  (pEVar4->setter)._M_string_length = 0;
  (pEVar4->setter).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(pEVar4->setter).field_2 + 8) = 0;
  (pEVar4->setter)._M_dataplus._M_p = (pointer)&(pEVar4->setter).field_2;
  (pEVar4->pos).__pos = pos.__pos;
  (pEVar4->pos).__state = pos.__state;
  puVar3 = *(uint8_t **)(buffer + 8);
  pEVar4->flags = *puVar3;
  (pEVar4->timestamp).__d.__r = *(long *)(puVar3 + 1) * 1000000000;
  (pEVar4->length).__r = *(rep *)(puVar3 + 9);
  pEVar4->steamid = *(uint64_t *)(puVar3 + 0x11);
  uVar2 = *(uint32_t *)(puVar3 + 0x19);
  *(uint8_t **)(buffer + 8) = puVar3 + 0x1d;
  pEVar4->ip = uVar2;
  uVar1 = puVar3[0x1d];
  *(uint8_t **)(buffer + 8) = puVar3 + 0x1e;
  pEVar4->prefix_length = uVar1;
  local_50._M_head_impl = pEVar4;
  _Jupiter_DataBuffer_partial_specialization_impl_std_string<std::__cxx11::basic_string>::
  interpret<char,std::char_traits<char>,std::allocator<char>>
            (&local_48,
             (_Jupiter_DataBuffer_partial_specialization_impl_std_string<std::__cxx11::basic_string>
              *)(buffer + 8),(uint8_t **)(puVar3 + 0x1d));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pEVar4->setter,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::unique_ptr<RenX::ExemptionDatabase::Entry,std::default_delete<RenX::ExemptionDatabase::Entry>>,std::allocator<std::unique_ptr<RenX::ExemptionDatabase::Entry,std::default_delete<RenX::ExemptionDatabase::Entry>>>>
  ::
  emplace_back<std::unique_ptr<RenX::ExemptionDatabase::Entry,std::default_delete<RenX::ExemptionDatabase::Entry>>>
            ((vector<std::unique_ptr<RenX::ExemptionDatabase::Entry,std::default_delete<RenX::ExemptionDatabase::Entry>>,std::allocator<std::unique_ptr<RenX::ExemptionDatabase::Entry,std::default_delete<RenX::ExemptionDatabase::Entry>>>>
              *)&this->m_entries,
             (unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>
              *)&local_50);
  if (local_50._M_head_impl != (Entry *)0x0) {
    std::default_delete<RenX::ExemptionDatabase::Entry>::operator()
              ((default_delete<RenX::ExemptionDatabase::Entry> *)&local_50,local_50._M_head_impl);
  }
  return;
}

Assistant:

void RenX::ExemptionDatabase::process_data(Jupiter::DataBuffer &buffer, FILE *file, fpos_t pos) {
	std::unique_ptr<Entry> entry = std::make_unique<Entry>();
	entry->pos = pos;

	// Read data from buffer to entry
	entry->flags = buffer.pop<uint8_t>();
	entry->timestamp = std::chrono::system_clock::time_point(std::chrono::seconds(buffer.pop<uint64_t>()));
	entry->length = std::chrono::seconds(buffer.pop<int64_t>());
	entry->steamid = buffer.pop<uint64_t>();
	entry->ip = buffer.pop<uint32_t>();
	entry->prefix_length = buffer.pop<uint8_t>();
	entry->setter = buffer.pop<std::string>();

	m_entries.push_back(std::move(entry));
}